

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixel.h
# Opt level: O0

type dlib::assign_pixel_helpers::assign<dlib::hsi_pixel,dlib::rgb_pixel>
               (hsi_pixel *dest,rgb_pixel *src)

{
  COLOUR c1_00;
  undefined1 *in_RDI;
  HSL c2;
  COLOUR c1;
  double local_60;
  double dStackY_58;
  double in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  double in_stack_ffffffffffffffc0;
  
  c1_00.g = (double)in_stack_ffffffffffffffb8;
  c1_00.r = in_stack_ffffffffffffffb0;
  c1_00.b = in_stack_ffffffffffffffc0;
  RGB2HSL(c1_00);
  *in_RDI = (char)(int)((local_60 / 360.0) * 255.0 + 0.5);
  in_RDI[1] = (char)(int)(dStackY_58 * 255.0 + 0.5);
  in_RDI[2] = (char)(int)(in_stack_ffffffffffffffb0 * 255.0 + 0.5);
  return;
}

Assistant:

typename enable_if_c<pixel_traits<P1>::hsi && pixel_traits<P2>::rgb>::type
        assign(P1& dest, const P2& src) 
        { 
            COLOUR c1;
            HSL c2;
            c1.r = src.red/255.0;
            c1.g = src.green/255.0;
            c1.b = src.blue/255.0;
            c2 = RGB2HSL(c1);

            dest.h = static_cast<unsigned char>(c2.h/360.0*255.0 + 0.5);
            dest.s = static_cast<unsigned char>(c2.s*255.0 + 0.5);
            dest.i = static_cast<unsigned char>(c2.l*255.0 + 0.5);
        }